

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devicehandlerlist_p.h
# Opt level: O2

int __thiscall
QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::remove
          (DeviceHandlerList<QEvdevTabletHandlerThread> *this,char *__filename)

{
  Device *pDVar1;
  __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>_>_>
  __position;
  __normal_iterator<const_QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device_*,_std::vector<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>_>_>
  _Var2;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device_const*,std::vector<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>>>,__gnu_cxx::__ops::_Iter_pred<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::remove(QString_const&)::_lambda(QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device_const&)_1_>>
                         ((this->v).
                          super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->v).
                          super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>_>
                          ._M_impl.super__Vector_impl_data._M_finish,__filename);
  pDVar1 = (this->v).
           super__Vector_base<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var2 = __position;
  if (__position._M_current != pDVar1) {
    _Var2._M_current =
         (Device *)
         std::
         vector<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::Device>_>
         ::erase(&this->v,__position._M_current);
  }
  return (int)CONCAT71((int7)((ulong)_Var2._M_current >> 8),__position._M_current != pDVar1);
}

Assistant:

bool remove(const QString &deviceNode)
    {
        const auto deviceNodeMatches = [&] (const Device &d) { return d.deviceNode == deviceNode; };
        const auto it = std::find_if(v.cbegin(), v.cend(), deviceNodeMatches);
        if (it == v.cend())
            return false;
        v.erase(it);
        return true;
    }